

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O3

void __thiscall TPZFBMatrix<double>::TPZFBMatrix(TPZFBMatrix<double> *this)

{
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFBMatrix_01862d68;
  (this->fElem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this->fElem).fStore = (double *)0x0;
  (this->fElem).fNElements = 0;
  (this->fElem).fNAlloc = 0;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  this->fBandLower = 0;
  this->fBandUpper = 0;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  return;
}

Assistant:

TPZFBMatrix<TVar>::TPZFBMatrix()
: TPZRegisterClassId(&TPZFBMatrix::ClassId),
TPZMatrix<TVar>( 0, 0 ), fElem()
{
	fBandLower = 0;
    fBandUpper = 0;
}